

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadDeepEXR(DeepImage *deepImage,char *filename,char **err)

{
  size_t __size;
  byte bVar1;
  int iVar2;
  unsigned_long srcSize;
  unsigned_long srcSize_00;
  pointer __n;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  pointer paVar5;
  int i_1;
  int iVar6;
  FP32 FVar7;
  FILE *__stream;
  size_type sVar8;
  char *pcVar9;
  float ***pppfVar10;
  float **ppfVar11;
  int *piVar12;
  reference dst;
  reference dst_00;
  ulong uVar13;
  float *pfVar14;
  ushort *puVar15;
  uint *puVar16;
  size_t sVar17;
  char **ppcVar18;
  int i;
  ulong uVar19;
  long lVar20;
  size_t __size_00;
  int iVar21;
  int x;
  int iVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  int *piVar27;
  FP16 h;
  uint uVar28;
  long lVar29;
  char *local_178;
  size_type local_168;
  ulong local_160;
  pointer local_158;
  allocator_type local_14d;
  int local_14c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int local_128;
  int local_120;
  uint local_118;
  ulong local_110;
  vector<long_long,_std::allocator<long_long>_> offsets;
  vector<float,_std::allocator<float>_> image;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  vector<int,_std::allocator<int>_> channelOffsetList;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampleData;
  vector<char,_std::allocator<char>_> buf;
  
  if (deepImage == (DeepImage *)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar9 = "Invalid argument.";
LAB_00113e14:
    *err = pcVar9;
    return -1;
  }
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar9 = "Cannot read file.";
    goto LAB_00113e14;
  }
  fseek(__stream,0,2);
  sVar8 = ftell(__stream);
  fseek(__stream,0,0);
  if (sVar8 == 0) {
    fclose(__stream);
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar9 = "File size is zero.";
    goto LAB_00113e14;
  }
  std::vector<char,_std::allocator<char>_>::vector(&buf,sVar8,(allocator_type *)&image);
  fread(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        ,1,sVar8,__stream);
  fclose(__stream);
  if (*(int *)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start == 0x1312f76) {
    if ((((buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[4] == '\x02') &&
         (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[5] == '\b')) &&
        (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start[6] == '\0')) &&
       (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [7] == '\0')) {
      local_178 = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + 8;
      channels.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      channels.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      channels.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar26 = -3;
      local_160 = 0xffffffff;
      local_128 = -1;
      local_120 = -1;
      iVar22 = -1;
      local_118 = 0xffffffff;
      local_168._0_4_ = 1;
      local_110 = local_160;
      do {
        image.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&image.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
        image.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        image.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_1_ = 0;
        offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar9 = anon_unknown.dwarf_11bb3::ReadAttribute
                           ((string *)&image,(string *)&offsets,&data,local_178);
        if (pcVar9 == (char *)0x0) {
          local_178 = local_178 + 1;
          iVar6 = 2;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&image);
          if (iVar6 == 0) {
            bVar1 = *data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (bVar1 < 4) {
              if (bVar1 == 3) {
                local_168._0_4_ = 0x10;
              }
              local_118 = (uint)bVar1;
LAB_00114096:
              iVar6 = 0;
              local_178 = pcVar9;
            }
            else {
              if (err != (char **)0x0) {
                *err = "Unsupported compression type.";
              }
              iVar26 = -5;
LAB_001140b0:
              iVar6 = 1;
            }
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)&image);
            if (iVar6 == 0) {
              anon_unknown.dwarf_11bb3::ReadChannelInfo(&channels,&data);
              local_110 = ((long)channels.
                                 super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)channels.
                                super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x30;
              if ((int)local_110 < 1) {
                if (err != (char **)0x0) {
                  *err = "Invalid channels format.";
                }
                iVar26 = -6;
                goto LAB_001140b0;
              }
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)&image);
              if (iVar6 == 0) {
                piVar12 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (&data,0);
                local_120 = *piVar12;
                piVar12 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (&data,4);
                local_128 = *piVar12;
                puVar16 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            (&data,8);
                local_160 = (ulong)*puVar16;
                piVar12 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (&data,0xc);
                iVar22 = *piVar12;
                goto LAB_00114096;
              }
              iVar6 = std::__cxx11::string::compare((char *)&image);
              if (iVar6 == 0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,0);
                iVar6 = 0;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,4);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,8);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,0xc);
                local_178 = pcVar9;
                goto LAB_001140b2;
              }
            }
            iVar6 = 0;
            local_178 = pcVar9;
          }
        }
LAB_001140b2:
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::__cxx11::string::~string((string *)&offsets);
        std::__cxx11::string::~string((string *)&image);
      } while (iVar6 == 0);
      if (iVar6 == 2) {
        local_120 = (int)local_160 - local_120;
        iVar26 = local_120 + 1;
        iVar22 = iVar22 - local_128;
        iVar6 = iVar22 + 1;
        std::vector<float,_std::allocator<float>_>::vector
                  (&image,(long)(iVar6 * iVar26 * 4),(allocator_type *)&offsets);
        uVar28 = (uint)((int)local_168 * (iVar6 / (int)local_168) <= iVar22) +
                 iVar6 / (int)local_168;
        local_14c = iVar6;
        std::vector<long_long,_std::allocator<long_long>_>::vector
                  (&offsets,(long)(int)uVar28,(allocator_type *)&data);
        uVar19 = 0;
        uVar25 = (ulong)uVar28;
        if ((int)uVar28 < 1) {
          uVar25 = uVar19;
        }
        for (; uVar25 != uVar19; uVar19 = uVar19 + 1) {
          offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar19] = *(longlong *)(local_178 + uVar19 * 8);
        }
        if ((local_118 < 4) && (local_118 != 1)) {
          iVar6 = (int)local_110;
          __size = (long)iVar6 * 8;
          pppfVar10 = (float ***)malloc(__size);
          deepImage->image = pppfVar10;
          lVar29 = (long)local_14c;
          uVar23 = 0;
          uVar19 = 0;
          if (0 < iVar6) {
            uVar19 = local_110 & 0xffffffff;
          }
          for (; ppfVar11 = (float **)malloc(lVar29 << 3), uVar19 != uVar23; uVar23 = uVar23 + 1) {
            deepImage->image[uVar23] = ppfVar11;
          }
          deepImage->offset_table = (int **)ppfVar11;
          for (lVar29 = 0;
              paVar5 = channels.
                       super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start, lVar29 <= iVar22;
              lVar29 = lVar29 + 1) {
            piVar12 = (int *)malloc((long)iVar26 * 4);
            deepImage->offset_table[lVar29] = piVar12;
          }
          local_158 = channels.
                      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          piVar12 = &(channels.
                      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start)->pixelType;
          for (uVar23 = 0; uVar23 != uVar25; uVar23 = uVar23 + 1) {
            lVar29 = offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar23];
            srcSize = *(unsigned_long *)
                       (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar29 + 4);
            srcSize_00 = *(unsigned_long *)
                          (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar29 + 0xc);
            __n = *(pointer *)
                   (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar29 + 0x14);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&data,(long)iVar26,
                       (allocator_type *)&sampleData);
            sampleData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                 -(long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            dst = std::vector<int,_std::allocator<int>_>::at
                            ((vector<int,_std::allocator<int>_> *)&data,0);
            anon_unknown.dwarf_11bb3::DecompressZip
                      ((uchar *)dst,(unsigned_long *)&sampleData,
                       (uchar *)(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar29 + 0x1c),srcSize);
            for (lVar20 = 0; lVar20 <= local_120; lVar20 = lVar20 + 1) {
              deepImage->offset_table[uVar23][lVar20] =
                   *(int *)(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar20 * 4);
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&sampleData,(size_type)__n,(allocator_type *)&channelOffsetList);
            channelOffsetList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = __n;
            dst_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&sampleData,0);
            anon_unknown.dwarf_11bb3::DecompressZip
                      (dst_00,(unsigned_long *)&channelOffsetList,
                       (uchar *)(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar29 + 0x1c + srcSize),
                       srcSize_00);
            std::vector<int,_std::allocator<int>_>::vector
                      (&channelOffsetList,(long)iVar6,&local_14d);
            piVar27 = piVar12;
            iVar22 = 0;
            for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
              channelOffsetList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13] = iVar22;
              iVar2 = *piVar27;
              if (iVar2 == 1) {
                iVar21 = iVar22 + 2;
              }
              else if (iVar2 == 0) {
                iVar21 = iVar22 + 4;
              }
              else {
                iVar21 = iVar22 + 4;
                if (iVar2 != 2) {
                  iVar21 = iVar22;
                }
              }
              piVar27 = piVar27 + 0xc;
              iVar22 = iVar21;
            }
            auVar3._8_4_ = 0;
            auVar3._0_8_ = (long)iVar22;
            auVar4._8_4_ = 0;
            auVar4._0_8_ = (long)sampleData.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)sampleData.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
            lVar20 = (long)SUB124(auVar4 / auVar3,0);
            lVar29 = SUB128(auVar4 / auVar3,0) << 0x20;
            __size_00 = lVar29 >> 0x1e;
            local_168 = 0;
            for (uVar13 = 0; uVar13 != uVar19; uVar13 = uVar13 + 1) {
              pfVar14 = (float *)malloc(__size_00);
              deepImage->image[uVar13][uVar23] = pfVar14;
              sVar17 = __size_00;
              if (paVar5[uVar13].pixelType == 0) {
                sVar8 = local_168;
                for (lVar24 = 0; lVar24 < lVar20; lVar24 = lVar24 + 1) {
                  puVar16 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                              (&sampleData,sVar8);
                  deepImage->image[uVar13][uVar23][lVar24] = (float)*puVar16;
                  sVar8 = sVar8 + 4;
                }
              }
              else if (paVar5[uVar13].pixelType == 1) {
                sVar8 = local_168;
                for (lVar24 = 0; sVar17 = lVar29 >> 0x1f, lVar24 < lVar20; lVar24 = lVar24 + 1) {
                  puVar15 = (ushort *)
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      (&sampleData,sVar8);
                  h._2_2_ = 0;
                  h.u = *puVar15;
                  FVar7 = anon_unknown.dwarf_11bb3::half_to_float(h);
                  *(FP32 *)(deepImage->image[uVar13][uVar23] + lVar24) = FVar7;
                  sVar8 = sVar8 + 2;
                }
              }
              else {
                sVar8 = local_168;
                for (lVar24 = 0; lVar24 < lVar20; lVar24 = lVar24 + 1) {
                  pfVar14 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                               (&sampleData,sVar8);
                  deepImage->image[uVar13][uVar23][lVar24] = *pfVar14;
                  sVar8 = sVar8 + 4;
                }
              }
              local_168 = local_168 + sVar17;
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&channelOffsetList.super__Vector_base<int,_std::allocator<int>_>);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sampleData);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&data);
          }
          deepImage->width = iVar26;
          deepImage->height = local_14c;
          ppcVar18 = (char **)malloc(__size);
          deepImage->channel_names = ppcVar18;
          for (uVar25 = 0; uVar19 != uVar25; uVar25 = uVar25 + 1) {
            pcVar9 = strdup((local_158->name)._M_dataplus._M_p);
            deepImage->channel_names[uVar25] = pcVar9;
            local_158 = local_158 + 1;
          }
          deepImage->num_channels = iVar6;
          iVar26 = 0;
        }
        else {
          iVar26 = -10;
          if (err != (char **)0x0) {
            *err = "Unsupported format.";
          }
        }
        std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                  (&offsets.super__Vector_base<long_long,_std::allocator<long_long>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&image.super__Vector_base<float,_std::allocator<float>_>);
      }
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::~vector(&channels);
      goto LAB_00113e44;
    }
    iVar26 = -4;
    if (err == (char **)0x0) goto LAB_00113e44;
    pcVar9 = "Unsupported version or scanline.";
  }
  else {
    iVar26 = -3;
    if (err == (char **)0x0) goto LAB_00113e44;
    pcVar9 = "Header mismatch.";
  }
  *err = pcVar9;
LAB_00113e44:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  return iVar26;
}

Assistant:

int LoadDeepEXR(DeepImage *deepImage, const char *filename, const char **err) {
  if (deepImage == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return -1;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  if (filesize == 0) {
    fclose(fp);
    if (err) {
      (*err) = "File size is zero.";
    }
    return -1;
  }

  std::vector<char> buf(filesize); // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    (void)ret;
  }
  fclose(fp);

  const char *head = &buf[0];
  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      if (err) {
        (*err) = "Header mismatch.";
      }
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // ver 2.0, scanline, deep bit on(0x800)
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 8 || marker[2] != 0 || marker[3] != 0) {
      if (err) {
        (*err) = "Unsupported version or scanline.";
      }
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int numScanlineBlocks = 1; // 16 for ZIP compression.
  int compressionType = -1;
  int numChannels = -1;
  std::vector<ChannelInfo> channels;

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE, 2: ZIPs or 3: ZIP
      if (data[0] > 3) {
        if (err) {
          (*err) = "Unsupported compression type.";
        }
        return -5;
      }

      compressionType = data[0];

      if (compressionType == 3) { // ZIP
        numScanlineBlocks = 16;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        if (err) {
          (*err) = "Invalid channels format.";
        }
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }

    } else if (attrName.compare("displayWindow") == 0) {
      int x;
      int y;
      int w;
      int h;
      memcpy(&x, &data.at(0), sizeof(int));
      memcpy(&y, &data.at(4), sizeof(int));
      memcpy(&w, &data.at(8), sizeof(int));
      memcpy(&h, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&x));
        swap4(reinterpret_cast<unsigned int *>(&y));
        swap4(reinterpret_cast<unsigned int *>(&w));
        swap4(reinterpret_cast<unsigned int *>(&h));
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  std::vector<float> image(dataWidth * dataHeight * 4); // 4 = RGBA

  // Read offset tables.
  int numBlocks = dataHeight / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < dataHeight) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  for (int y = 0; y < numBlocks; y++) {
    long long offset;
    memcpy(&offset, marker, sizeof(long long));
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offset));
    }
    marker += sizeof(long long); // = 8
    offsets[y] = offset;
  }

  if (compressionType != 0 && compressionType != 2 && compressionType != 3) {
    if (err) {
      (*err) = "Unsupported format.";
    }
    return -10;
  }

  deepImage->image = (float ***)malloc(sizeof(float **) * numChannels);
  for (int c = 0; c < numChannels; c++) {
    deepImage->image[c] = (float **)malloc(sizeof(float *) * dataHeight);
    for (int y = 0; y < dataHeight; y++) {
    }
  }

  deepImage->offset_table = (int **)malloc(sizeof(int *) * dataHeight);
  for (int y = 0; y < dataHeight; y++) {
    deepImage->offset_table[y] = (int *)malloc(sizeof(int) * dataWidth);
  }

  for (int y = 0; y < numBlocks; y++) {
    const unsigned char *dataPtr =
        reinterpret_cast<const unsigned char *>(head + offsets[y]);

    // int: y coordinate
    // int64: packed size of pixel offset table
    // int64: packed size of sample data
    // int64: unpacked size of sample data
    // compressed pixel offset table
    // compressed sample data
    int lineNo;
    long long packedOffsetTableSize;
    long long packedSampleDataSize;
    long long unpackedSampleDataSize;
    memcpy(&lineNo, dataPtr, sizeof(int));
    memcpy(&packedOffsetTableSize, dataPtr + 4, sizeof(long long));
    memcpy(&packedSampleDataSize, dataPtr + 12, sizeof(long long));
    memcpy(&unpackedSampleDataSize, dataPtr + 20, sizeof(long long));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&lineNo));
      swap8(reinterpret_cast<unsigned long long *>(&packedOffsetTableSize));
      swap8(reinterpret_cast<unsigned long long *>(&packedSampleDataSize));
      swap8(reinterpret_cast<unsigned long long *>(&unpackedSampleDataSize));
    }

    std::vector<int> pixelOffsetTable(dataWidth);

    // decode pixel offset table.
    {
      unsigned long dstLen = pixelOffsetTable.size() * sizeof(int);
      DecompressZip(reinterpret_cast<unsigned char *>(&pixelOffsetTable.at(0)),
                    dstLen, dataPtr + 28, packedOffsetTableSize);

      assert(dstLen == pixelOffsetTable.size() * sizeof(int));
      for (int i = 0; i < dataWidth; i++) {
        deepImage->offset_table[y][i] = pixelOffsetTable[i];
      }
    }

    std::vector<unsigned char> sampleData(unpackedSampleDataSize);

    // decode sample data.
    {
      unsigned long dstLen = unpackedSampleDataSize;
      DecompressZip(reinterpret_cast<unsigned char *>(&sampleData.at(0)),
                    dstLen, dataPtr + 28 + packedOffsetTableSize,
                    packedSampleDataSize);
      assert(dstLen == (unsigned long)unpackedSampleDataSize);
    }

    // decode sample
    int sampleSize = -1;
    std::vector<int> channelOffsetList(numChannels);
    {
      int channelOffset = 0;
      for (int i = 0; i < numChannels; i++) {
        channelOffsetList[i] = channelOffset;
        if (channels[i].pixelType == TINYEXR_PIXELTYPE_UINT) { // UINT
          channelOffset += 4;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_HALF) { // half
          channelOffset += 2;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_FLOAT) { // float
          channelOffset += 4;
        } else {
          assert(0);
        }
      }
      sampleSize = channelOffset;
    }
    assert(sampleSize >= 2);

    assert((size_t)(pixelOffsetTable[dataWidth - 1] * sampleSize) ==
           sampleData.size());
    int samplesPerLine = sampleData.size() / sampleSize;

    //
    // Alloc memory
    //

    //
    // pixel data is stored as image[channels][pixel_samples]
    //
    {
      unsigned long long dataOffset = 0;
      for (int c = 0; c < numChannels; c++) {

        deepImage->image[c][y] =
            (float *)malloc(sizeof(float) * samplesPerLine);

        if (channels[c].pixelType == 0) { // UINT
          for (int x = 0; x < samplesPerLine; x++) {
            unsigned int ui = *reinterpret_cast<unsigned int *>(
                                  &sampleData.at(dataOffset + x * sizeof(int)));
            deepImage->image[c][y][x] = (float)ui; // @fixme
          }
          dataOffset += sizeof(unsigned int) * samplesPerLine;
        } else if (channels[c].pixelType == 1) { // half
          for (int x = 0; x < samplesPerLine; x++) {
            FP16 f16;
            f16.u = *reinterpret_cast<unsigned short *>(
                        &sampleData.at(dataOffset + x * sizeof(short)));
            FP32 f32 = half_to_float(f16);
            deepImage->image[c][y][x] = f32.f;
          }
          dataOffset += sizeof(short) * samplesPerLine;
        } else { // float
          for (int x = 0; x < samplesPerLine; x++) {
            float f = *reinterpret_cast<float *>(
                          &sampleData.at(dataOffset + x * sizeof(float)));
            deepImage->image[c][y][x] = f;
          }
          dataOffset += sizeof(float) * samplesPerLine;
        }
      }
    }

  } // y

  deepImage->width = dataWidth;
  deepImage->height = dataHeight;

  deepImage->channel_names =
      (const char **)malloc(sizeof(const char *) * numChannels);
  for (int c = 0; c < numChannels; c++) {
#ifdef _WIN32
    deepImage->channel_names[c] = _strdup(channels[c].name.c_str());
#else
    deepImage->channel_names[c] = strdup(channels[c].name.c_str());
#endif
  }
  deepImage->num_channels = numChannels;

  return 0; // OK
}